

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O0

void __thiscall Control::begin(Control *this)

{
  time_t tVar1;
  GameData local_120;
  GameOperator local_94;
  undefined1 local_90 [4];
  GameOperator Operator;
  GameData Data;
  Draw DrawUi;
  Control *this_local;
  
  Draw::Draw((Draw *)&Data.field_0x77);
  GameData::GameData((GameData *)local_90);
  GameOperator::GameOperator(&local_94);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  GameData::GameData(&local_120,(GameData *)local_90);
  loop(this,&local_120,local_94.statusNum);
  GameData::~GameData(&local_120);
  GameData::~GameData((GameData *)local_90);
  return;
}

Assistant:

void Control::begin() {
    Draw DrawUi;
    GameData Data;
    GameOperator Operator;
    srand((unsigned) time(NULL));
    loop(Data, DrawUi, Operator);
}